

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.h
# Opt level: O2

void __thiscall
embree::sse2::CurveGeometryInterface<embree::BezierCurveT>::interpolate_impl<4>
          (CurveGeometryInterface<embree::BezierCurveT> *this,RTCInterpolateArguments *args)

{
  uint *puVar1;
  float *pfVar2;
  float *pfVar3;
  uint uVar4;
  uint uVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  char *pcVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  vector<BufferView<Vec3ff>_> *pvVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  
  uVar4 = args->primID;
  fVar17 = args->u;
  pfVar6 = args->P;
  pfVar7 = args->dPdu;
  pfVar8 = args->ddPdudu;
  uVar5 = args->valueCount;
  pvVar13 = &(this->super_CurveGeometry).vertices;
  if (args->bufferType == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE) {
    pvVar13 = (vector<BufferView<Vec3ff>_> *)&(this->super_CurveGeometry).vertexAttribs;
  }
  pcVar9 = pvVar13->items[args->bufferSlot].super_RawBufferView.ptr_ofs;
  uVar15 = (ulong)(uint)pvVar13->items[args->bufferSlot].super_RawBufferView.stride;
  fVar18 = 1.0 - fVar17;
  fVar19 = fVar18 * fVar18;
  fVar25 = fVar18 * fVar19;
  fVar26 = fVar17 * 3.0 * fVar19;
  fVar33 = fVar17 * fVar17;
  fVar35 = fVar17 * fVar33;
  fVar31 = fVar17 * fVar18 + fVar17 * fVar18;
  fVar34 = fVar33 * 3.0;
  fVar36 = fVar18 * fVar34;
  fVar20 = fVar19 * -3.0;
  fVar32 = (fVar19 - fVar31) * 3.0;
  fVar31 = (fVar31 - fVar33) * 3.0;
  fVar19 = fVar18 * 6.0;
  fVar33 = (fVar17 - (fVar18 + fVar18)) * 6.0;
  fVar18 = (fVar18 - (fVar17 + fVar17)) * 6.0;
  fVar17 = fVar17 * 6.0;
  for (uVar16 = 0; uVar16 < uVar5; uVar16 = uVar16 + 4) {
    uVar14 = (ulong)*(uint *)(*(long *)&(this->super_CurveGeometry).super_Geometry.field_0x58 +
                             *(long *)&(this->super_CurveGeometry).field_0x68 * (ulong)uVar4);
    uVar44 = (uint)uVar16;
    uVar41 = -(uint)((int)uVar44 < (int)uVar5);
    uVar42 = -(uint)((int)(uVar44 | 1) < (int)uVar5);
    uVar43 = -(uint)((int)(uVar44 | 2) < (int)uVar5);
    uVar44 = -(uint)((int)(uVar44 | 3) < (int)uVar5);
    puVar1 = (uint *)(pcVar9 + uVar16 * 4 + uVar15 * uVar14);
    fVar45 = (float)(*puVar1 & uVar41);
    fVar46 = (float)(puVar1[1] & uVar42);
    fVar47 = (float)(puVar1[2] & uVar43);
    fVar48 = (float)(puVar1[3] & uVar44);
    puVar1 = (uint *)(pcVar9 + uVar16 * 4 + (uVar14 + 1) * uVar15);
    fVar37 = (float)(*puVar1 & uVar41);
    fVar38 = (float)(puVar1[1] & uVar42);
    fVar39 = (float)(puVar1[2] & uVar43);
    fVar40 = (float)(puVar1[3] & uVar44);
    puVar1 = (uint *)(pcVar9 + uVar16 * 4 + (uVar14 + 2) * uVar15);
    fVar21 = (float)(*puVar1 & uVar41);
    fVar22 = (float)(puVar1[1] & uVar42);
    fVar23 = (float)(puVar1[2] & uVar43);
    fVar24 = (float)(puVar1[3] & uVar44);
    puVar1 = (uint *)(pcVar9 + uVar16 * 4 + (uVar14 + 3) * uVar15);
    fVar27 = (float)(*puVar1 & uVar41);
    fVar28 = (float)(puVar1[1] & uVar42);
    fVar29 = (float)(puVar1[2] & uVar43);
    fVar30 = (float)(puVar1[3] & uVar44);
    if (pfVar6 != (float *)0x0) {
      pfVar2 = pfVar6 + uVar16;
      fVar10 = pfVar2[1];
      fVar11 = pfVar2[2];
      fVar12 = pfVar2[3];
      pfVar3 = pfVar6 + uVar16;
      *pfVar3 = (float)((uint)(fVar25 * fVar45 + fVar26 * fVar37 + fVar36 * fVar21 + fVar35 * fVar27
                              ) & uVar41 | ~uVar41 & (uint)*pfVar2);
      pfVar3[1] = (float)((uint)(fVar25 * fVar46 +
                                fVar26 * fVar38 + fVar36 * fVar22 + fVar35 * fVar28) & uVar42 |
                         ~uVar42 & (uint)fVar10);
      pfVar3[2] = (float)((uint)(fVar25 * fVar47 +
                                fVar26 * fVar39 + fVar36 * fVar23 + fVar35 * fVar29) & uVar43 |
                         ~uVar43 & (uint)fVar11);
      pfVar3[3] = (float)((uint)(fVar25 * fVar48 +
                                fVar26 * fVar40 + fVar36 * fVar24 + fVar35 * fVar30) & uVar44 |
                         ~uVar44 & (uint)fVar12);
    }
    if (pfVar7 != (float *)0x0) {
      pfVar2 = pfVar7 + uVar16;
      fVar10 = pfVar2[1];
      fVar11 = pfVar2[2];
      fVar12 = pfVar2[3];
      pfVar3 = pfVar7 + uVar16;
      *pfVar3 = (float)((uint)(fVar20 * fVar45 + fVar32 * fVar37 + fVar31 * fVar21 + fVar34 * fVar27
                              ) & uVar41 | ~uVar41 & (uint)*pfVar2);
      pfVar3[1] = (float)((uint)(fVar20 * fVar46 +
                                fVar32 * fVar38 + fVar31 * fVar22 + fVar34 * fVar28) & uVar42 |
                         ~uVar42 & (uint)fVar10);
      pfVar3[2] = (float)((uint)(fVar20 * fVar47 +
                                fVar32 * fVar39 + fVar31 * fVar23 + fVar34 * fVar29) & uVar43 |
                         ~uVar43 & (uint)fVar11);
      pfVar3[3] = (float)((uint)(fVar20 * fVar48 +
                                fVar32 * fVar40 + fVar31 * fVar24 + fVar34 * fVar30) & uVar44 |
                         ~uVar44 & (uint)fVar12);
    }
    if (pfVar8 != (float *)0x0) {
      pfVar2 = pfVar8 + uVar16;
      fVar10 = pfVar2[1];
      fVar11 = pfVar2[2];
      fVar12 = pfVar2[3];
      pfVar3 = pfVar8 + uVar16;
      *pfVar3 = (float)(~uVar41 & (uint)*pfVar2 |
                       (uint)(fVar45 * fVar19 + fVar37 * fVar33 + fVar21 * fVar18 + fVar27 * fVar17)
                       & uVar41);
      pfVar3[1] = (float)(~uVar42 & (uint)fVar10 |
                         (uint)(fVar46 * fVar19 +
                               fVar38 * fVar33 + fVar22 * fVar18 + fVar28 * fVar17) & uVar42);
      pfVar3[2] = (float)(~uVar43 & (uint)fVar11 |
                         (uint)(fVar47 * fVar19 +
                               fVar39 * fVar33 + fVar23 * fVar18 + fVar29 * fVar17) & uVar43);
      pfVar3[3] = (float)(~uVar44 & (uint)fVar12 |
                         (uint)(fVar48 * fVar19 +
                               fVar40 * fVar33 + fVar24 * fVar18 + fVar30 * fVar17) & uVar44);
    }
  }
  return;
}

Assistant:

void interpolate_impl(const RTCInterpolateArguments* const args)
    {
      unsigned int primID = args->primID;
      float u = args->u;
      RTCBufferType bufferType = args->bufferType;
      unsigned int bufferSlot = args->bufferSlot;
      float* P = args->P;
      float* dPdu = args->dPdu;
      float* ddPdudu = args->ddPdudu;
      unsigned int valueCount = args->valueCount;
      
      /* calculate base pointer and stride */
      assert((bufferType == RTC_BUFFER_TYPE_VERTEX && bufferSlot < numTimeSteps) ||
             (bufferType == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE && bufferSlot <= vertexAttribs.size()));
      const char* src = nullptr; 
      size_t stride = 0;
      if (bufferType == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE) {
        src    = vertexAttribs[bufferSlot].getPtr();
        stride = vertexAttribs[bufferSlot].getStride();
      } else {
        src    = vertices[bufferSlot].getPtr();
        stride = vertices[bufferSlot].getStride();
      }

      for (unsigned int i=0; i<valueCount; i+=N)
      {
        size_t ofs = i*sizeof(float);
        const size_t index = curves[primID];
        const vbool<N> valid = vint<N>((int)i)+vint<N>(step) < vint<N>((int)valueCount);
        const vfloat<N> p0 = mem<vfloat<N>>::loadu(valid,(float*)&src[(index+0)*stride+ofs]);
        const vfloat<N> p1 = mem<vfloat<N>>::loadu(valid,(float*)&src[(index+1)*stride+ofs]);
        const vfloat<N> p2 = mem<vfloat<N>>::loadu(valid,(float*)&src[(index+2)*stride+ofs]);
        const vfloat<N> p3 = mem<vfloat<N>>::loadu(valid,(float*)&src[(index+3)*stride+ofs]);
        
        const Curve<vfloat<N>> curve(p0,p1,p2,p3);
        if (P      ) mem<vfloat<N>>::storeu(valid,P+i,      curve.eval(u));
        if (dPdu   ) mem<vfloat<N>>::storeu(valid,dPdu+i,   curve.eval_du(u));
        if (ddPdudu) mem<vfloat<N>>::storeu(valid,ddPdudu+i,curve.eval_dudu(u));
      }
    }